

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiDockNode *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *g;
  ulong uVar7;
  byte bVar8;
  ushort uVar9;
  long lVar10;
  ImGuiWindow *pIVar11;
  ushort uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 pos_old;
  ImVec2 size_old;
  
  pIVar5 = GImGui;
  pIVar11 = (ImGuiWindow *)host_node;
  if ((host_node != (ImGuiDockNode *)0x0) &&
     (pIVar6 = (ImGuiWindow *)host_node, (host_node->field_0xb1 & 2) == 0)) {
    do {
      pIVar11 = pIVar6;
      pIVar6 = *(ImGuiWindow **)&pIVar11->FlagsPreviousFrame;
    } while (*(ImGuiWindow **)&pIVar11->FlagsPreviousFrame != (ImGuiWindow *)0x0);
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = host_node->LocalFlags | host_node->SharedFlags;
  }
  pIVar4 = root_payload->DockNodeAsHost;
  data->IsCenterAvailable = true;
  if (((!is_outer_docking) && ((host_node == (ImGuiDockNode *)0x0 || ((uVar13 & 0x10000) == 0)))) &&
     ((host_node == (ImGuiDockNode *)0x0 ||
      (((uVar13 & 4) == 0 || ((host_node->LocalFlags & 0x800) == 0)))))) {
    if (host_node == (ImGuiDockNode *)0x0) {
      if (pIVar4 == (ImGuiDockNode *)0x0) goto LAB_0016874c;
    }
    else if (pIVar4 == (ImGuiDockNode *)0x0 ||
             (host_node->Windows).Size == 0 && host_node->ChildNodes[0] == (ImGuiDockNode *)0x0)
    goto LAB_0016874c;
    if ((pIVar4->ChildNodes[0] == (ImGuiDockNode *)0x0) ||
       (pIVar4->OnlyNodeWithWindows != (ImGuiDockNode *)0x0)) goto LAB_0016874c;
  }
  data->IsCenterAvailable = false;
LAB_0016874c:
  data->IsSidesAvailable = true;
  if ((((host_node != (ImGuiDockNode *)0x0) && ((uVar13 & 0x10) != 0)) ||
      ((pIVar5->IO).ConfigDockingNoSplit != false)) ||
     (((host_node != (ImGuiDockNode *)0x0 && !is_outer_docking &&
       (host_node->ParentNode == (ImGuiDockNode *)0x0)) && ((host_node->LocalFlags & 0x800) != 0))))
  {
    data->IsSidesAvailable = false;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    bVar8 = host_window->HasCloseButton;
  }
  else {
    bVar8 = (host_node->field_0xb1 & 8) >> 3;
  }
  uVar12 = 0x800;
  if (bVar8 == 0) {
    iVar3._0_1_ = root_payload->HasCloseButton;
    iVar3._1_1_ = root_payload->ResizeBorderHeld;
    iVar3._2_2_ = root_payload->BeginCount;
    uVar12 = (ushort)(iVar3 << 0xb);
  }
  uVar12 = uVar12 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 & 0xf7ff;
  *(ushort *)&(data->FutureNode).field_0xb0 = uVar12;
  uVar9 = 0x1000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar9 = (ushort)((~host_window->Flags & 0x20U) << 7);
    pIVar11 = host_window;
  }
  *(ushort *)&(data->FutureNode).field_0xb0 = uVar9 | uVar12 & 0xefff;
  (data->FutureNode).Pos = pIVar11->Pos;
  (data->FutureNode).Size = pIVar11->Size;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar13 = 0xffffffff;
    lVar10 = 0;
    do {
      bVar15 = lVar10 == 0;
      if (bVar15) {
        if (data->IsCenterAvailable != false) goto LAB_001689bc;
      }
      else {
        if (data->IsSidesAvailable != true) goto LAB_00168caa;
LAB_001689bc:
        IVar2 = (data->FutureNode).Pos;
        fVar20 = IVar2.x;
        fVar23 = IVar2.y;
        IVar2 = (data->FutureNode).Size;
        fVar19 = IVar2.x + fVar20;
        fVar17 = IVar2.y + fVar23;
        fVar25 = fVar19 - fVar20;
        fVar26 = fVar17 - fVar23;
        fVar18 = fVar25;
        if (fVar26 <= fVar25) {
          fVar18 = fVar26;
        }
        fVar21 = pIVar5->FontSize;
        uVar16 = -(uint)(fVar18 * 0.125 <= fVar21 * 0.5);
        fVar22 = (float)(uVar16 & (uint)(fVar21 * 0.5) | ~uVar16 & (uint)(fVar18 * 0.125));
        fVar18 = fVar21 * 1.5;
        if (fVar22 <= fVar21 * 1.5) {
          fVar18 = fVar22;
        }
        if (is_outer_docking) {
          fVar22 = (float)(int)(fVar18 * 0.8);
          fVar24 = (float)(int)(fVar18 * 1.5);
          fVar18 = (pIVar5->Style).FramePadding.y;
          fVar18 = (fVar18 + fVar18 + fVar21 + (pIVar5->Style).ItemSpacing.y) * -0.0;
          fVar25 = (float)(int)((fVar25 * 0.5 + fVar18) - fVar22);
          fVar18 = (float)(int)((fVar26 * 0.5 + fVar18) - fVar22);
        }
        else {
          fVar22 = (float)(int)(fVar18 * 0.9);
          fVar24 = (float)(int)fVar18;
          fVar25 = (float)(int)(fVar24 * 2.4);
          fVar18 = fVar25;
        }
        fVar20 = (float)(int)((fVar20 + fVar19) * 0.5);
        fVar23 = (float)(int)((fVar23 + fVar17) * 0.5);
        fVar19 = fVar24;
        fVar17 = fVar23;
        if (lVar10 == 0) {
LAB_00168b63:
          fVar26 = fVar20 - fVar24;
          fVar21 = fVar17 - fVar19;
          fVar25 = fVar24 + fVar20;
          fVar19 = fVar19 + fVar17;
          goto LAB_00168b70;
        }
        switch(uVar13) {
        case 0:
          fVar26 = (fVar20 - fVar25) - fVar22;
          fVar21 = fVar23 - fVar24;
          fVar25 = (fVar20 - fVar25) + fVar22;
          fVar19 = fVar23 + fVar24;
          break;
        case 1:
          fVar26 = (fVar25 + fVar20) - fVar22;
          fVar21 = fVar23 - fVar24;
          fVar25 = fVar25 + fVar20 + fVar22;
          fVar19 = fVar23 + fVar24;
          break;
        case 2:
          fVar26 = fVar20 - fVar24;
          fVar21 = (fVar23 - fVar18) - fVar22;
          fVar25 = fVar24 + fVar20;
          fVar19 = fVar22 + (fVar23 - fVar18);
          break;
        case 3:
          fVar19 = fVar22;
          fVar17 = fVar18 + fVar23;
          goto LAB_00168b63;
        default:
          goto switchD_00168ae2_default;
        }
LAB_00168b70:
        pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar10);
        *pfVar1 = fVar26;
        pfVar1[1] = fVar21;
        pfVar1[2] = fVar25;
        pfVar1[3] = fVar19;
switchD_00168ae2_default:
        pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar10);
        fVar18 = *pfVar1;
        fVar19 = pfVar1[1];
        fVar17 = pfVar1[2];
        fVar25 = pfVar1[3];
        if (is_outer_docking) {
LAB_00168c4d:
          fVar20 = (pIVar5->IO).MousePos.x;
          if (fVar20 < fVar18) goto LAB_00168caa;
          fVar18 = (pIVar5->IO).MousePos.y;
          bVar15 = fVar18 < fVar25 && (fVar20 < fVar17 && fVar19 <= fVar18);
        }
        else {
          IVar2 = (pIVar5->IO).MousePos;
          fVar20 = IVar2.x - fVar20;
          fVar23 = IVar2.y - fVar23;
          fVar26 = fVar20 * fVar20 + fVar23 * fVar23;
          if (fVar26 < fVar24 * 1.4 * fVar24 * 1.4) {
LAB_00168c2b:
            bVar14 = false;
          }
          else {
            bVar14 = true;
            if (fVar26 < fVar24 * 2.6 * fVar24 * 2.6) {
              uVar16 = (uint)(0.0 < fVar20);
              if (ABS(fVar20) <= ABS(fVar23)) {
                uVar16 = 0.0 < fVar23 | 2;
              }
              bVar15 = uVar13 == uVar16;
              goto LAB_00168c2b;
            }
          }
          if (bVar14) {
            fVar20 = (float)(int)(fVar24 * 0.3);
            fVar17 = fVar17 + fVar20;
            fVar25 = fVar25 + fVar20;
            fVar18 = fVar18 - fVar20;
            fVar19 = fVar19 - fVar20;
            goto LAB_00168c4d;
          }
        }
        if (bVar15) {
          data->SplitDir = uVar13;
          data->IsSplitDirExplicit = true;
        }
      }
LAB_00168caa:
      lVar10 = lVar10 + 0x10;
      uVar13 = uVar13 + 1;
    } while (lVar10 != 0x50);
  }
  uVar13 = data->SplitDir;
  bVar15 = true;
  if (uVar13 == 0xffffffff) {
    bVar15 = data->IsCenterAvailable;
  }
  data->IsDropAllowed = bVar15;
  if (((!is_explicit_target) && (data->IsSplitDirExplicit == false)) &&
     ((pIVar5->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (uVar13 != 0xffffffff) {
    bVar14 = uVar13 < 2;
    bVar15 = !bVar14;
    local_30.x = 0.0;
    local_30.y = 0.0;
    local_38 = (data->FutureNode).Pos;
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_28 = (data->FutureNode).Size;
    pos_old = root_payload->Size;
    fVar18 = (pIVar5->Style).ItemInnerSpacing.x;
    (&local_30.x)[bVar14] = (&local_38.x)[bVar14];
    (&local_40.x)[bVar14] = (&local_28.x)[bVar14];
    uVar7 = (ulong)((uint)bVar15 * 4);
    fVar17 = *(float *)((long)&local_28.x + uVar7) - fVar18;
    fVar19 = *(float *)((long)&pos_old.x + uVar7);
    fVar20 = fVar17 * 0.5;
    if (fVar19 <= 0.0 || fVar20 < fVar19) {
      fVar19 = (float)(int)fVar20;
    }
    *(float *)((long)&local_40.x + uVar7) = fVar19;
    fVar19 = (float)(int)(fVar17 - fVar19);
    *(float *)((long)&local_28.x + uVar7) = fVar19;
    uVar13 = uVar13 & 0xfffffffd;
    if (uVar13 == 0) {
      uVar7 = (ulong)((uint)bVar15 * 4);
      fVar19 = *(float *)((long)&local_38.x + uVar7);
      *(float *)((long)&local_30.x + uVar7) = fVar19;
      *(float *)((long)&local_38.x + uVar7) =
           fVar18 + fVar19 + *(float *)((long)&local_40.x + uVar7);
    }
    else if (uVar13 == 1) {
      *(float *)((long)&local_30.x + (ulong)((uint)bVar15 * 4)) =
           fVar18 + fVar19 + *(float *)((long)&local_38.x + (ulong)((uint)bVar15 * 4));
    }
    fVar19 = (&local_40.x)[bVar15] /
             *(float *)((long)(data->FutureNode).ChildNodes + (ulong)bVar15 * 4 + 0x30);
    fVar18 = 1.0;
    if (fVar19 <= 1.0) {
      fVar18 = fVar19;
    }
    fVar18 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar18);
    (data->FutureNode).Pos = local_30;
    (data->FutureNode).Size = local_40;
    if (uVar13 == 1) {
      fVar18 = 1.0 - fVar18;
    }
    data->SplitRatio = fVar18;
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags host_node_flags = host_node ? host_node->GetMergedFlags() : 0;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDocking))
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((host_node && (host_node_flags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = host_node ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = host_node ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}